

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O2

void __thiscall iDynTree::MatrixFixSize<6U,_6U>::zero(MatrixFixSize<6U,_6U> *this)

{
  size_t row;
  size_t col;
  long lVar1;
  
  for (row = 0; row != 6; row = row + 1) {
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      *(double *)((long)this + lVar1 * 8) = 0.0;
    }
    this = (MatrixFixSize<6U,_6U> *)((long)this + 0x30);
  }
  return;
}

Assistant:

void MatrixFixSize<nRows,nCols>::zero()
    {
        for(std::size_t row=0; row < this->rows(); row++ )
        {
            for(std::size_t col=0; col < this->cols(); col++ )
            {
                this->m_data[rawIndexRowMajor(row,col)] = 0.0;
            }
        }
    }